

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_io_components_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::EliminateDeadIOComponentsPass::ChangeArrayLength
          (EliminateDeadIOComponentsPass *this,Instruction *arr_var,uint length)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  StorageClass sc;
  IRContext *pIVar4;
  TypeManager *this_00;
  ConstantManager *this_01;
  DefUseManager *this_02;
  Type *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32_t new_ptr_ty_id;
  Type *reg_new_ptr_ty;
  Pointer new_ptr_ty;
  Type *reg_new_arr_ty;
  undefined1 local_a0 [8];
  Array new_arr_ty;
  uint32_t length_id;
  Array *arr_ty;
  Pointer *ptr_type;
  DefUseManager *def_use_mgr;
  ConstantManager *const_mgr;
  TypeManager *type_mgr;
  uint length_local;
  Instruction *arr_var_local;
  EliminateDeadIOComponentsPass *this_local;
  Array *this_03;
  
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_type_mgr(pIVar4);
  pIVar4 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_constant_mgr(pIVar4);
  pIVar4 = Pass::context(&this->super_Pass);
  this_02 = IRContext::get_def_use_mgr(pIVar4);
  uVar1 = Instruction::type_id(arr_var);
  pTVar5 = analysis::TypeManager::GetType(this_00,uVar1);
  iVar2 = (*pTVar5->_vptr_Type[0x1f])();
  pTVar5 = analysis::Pointer::pointee_type((Pointer *)CONCAT44(extraout_var,iVar2));
  iVar3 = (*pTVar5->_vptr_Type[0x18])();
  this_03 = (Array *)CONCAT44(extraout_var_00,iVar3);
  if (this_03 == (Array *)0x0) {
    __assert_fail("arr_ty && \"expecting array type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_io_components_pass.cpp"
                  ,0xc5,
                  "void spvtools::opt::EliminateDeadIOComponentsPass::ChangeArrayLength(Instruction &, unsigned int)"
                 );
  }
  new_arr_ty.length_info_.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       analysis::ConstantManager::GetUIntConstId(this_01,length);
  pTVar5 = analysis::Array::element_type(this_03);
  analysis::Array::GetConstantLengthInfo
            ((LengthInfo *)&reg_new_arr_ty,this_03,
             new_arr_ty.length_info_.words.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,length);
  analysis::Array::Array((Array *)local_a0,pTVar5,(LengthInfo *)&reg_new_arr_ty);
  analysis::Array::LengthInfo::~LengthInfo((LengthInfo *)&reg_new_arr_ty);
  pTVar5 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_a0);
  new_ptr_ty._48_8_ = pTVar5;
  sc = analysis::Pointer::storage_class((Pointer *)CONCAT44(extraout_var,iVar2));
  analysis::Pointer::Pointer((Pointer *)&reg_new_ptr_ty,pTVar5,sc);
  pTVar5 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)&reg_new_ptr_ty);
  uVar1 = analysis::TypeManager::GetTypeInstruction(this_00,pTVar5);
  Instruction::SetResultType(arr_var,uVar1);
  analysis::DefUseManager::AnalyzeInstUse(this_02,arr_var);
  analysis::Pointer::~Pointer((Pointer *)&reg_new_ptr_ty);
  analysis::Array::~Array((Array *)local_a0);
  return;
}

Assistant:

void EliminateDeadIOComponentsPass::ChangeArrayLength(Instruction& arr_var,
                                                      unsigned length) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::Pointer* ptr_type =
      type_mgr->GetType(arr_var.type_id())->AsPointer();
  const analysis::Array* arr_ty = ptr_type->pointee_type()->AsArray();
  assert(arr_ty && "expecting array type");
  uint32_t length_id = const_mgr->GetUIntConstId(length);
  analysis::Array new_arr_ty(arr_ty->element_type(),
                             arr_ty->GetConstantLengthInfo(length_id, length));
  analysis::Type* reg_new_arr_ty = type_mgr->GetRegisteredType(&new_arr_ty);
  analysis::Pointer new_ptr_ty(reg_new_arr_ty, ptr_type->storage_class());
  analysis::Type* reg_new_ptr_ty = type_mgr->GetRegisteredType(&new_ptr_ty);
  uint32_t new_ptr_ty_id = type_mgr->GetTypeInstruction(reg_new_ptr_ty);
  arr_var.SetResultType(new_ptr_ty_id);
  def_use_mgr->AnalyzeInstUse(&arr_var);
}